

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

uint32 __thiscall
Js::RecyclableArgumentsObjectWalker::GetChildrenCount(RecyclableArgumentsObjectWalker *this)

{
  RecyclableArrayWalker *pRVar1;
  RecyclableArgumentsArrayWalker *this_00;
  uint32 uVar2;
  uint32 count;
  
  pRVar1 = (this->super_RecyclableObjectWalker).innerArrayObjectWalker;
  uVar2 = RecyclableObjectWalker::GetChildrenCount(&this->super_RecyclableObjectWalker);
  if ((pRVar1 == (RecyclableArrayWalker *)0x0) &&
     (this_00 = (RecyclableArgumentsArrayWalker *)
                (this->super_RecyclableObjectWalker).innerArrayObjectWalker,
     this_00 != (RecyclableArgumentsArrayWalker *)0x0)) {
    RecyclableArgumentsArrayWalker::FetchFormalsAddress(this_00,this->pLocalsWalker);
  }
  return uVar2;
}

Assistant:

uint32 RecyclableArgumentsObjectWalker::GetChildrenCount()
    {
        if (innerArrayObjectWalker == nullptr)
        {
            uint32 count = RecyclableObjectWalker::GetChildrenCount();
            if (innerArrayObjectWalker != nullptr)
            {
                RecyclableArgumentsArrayWalker *pWalker = static_cast<RecyclableArgumentsArrayWalker *> (innerArrayObjectWalker);
                pWalker->FetchFormalsAddress(pLocalsWalker);
            }
            return count;
        }

        return RecyclableObjectWalker::GetChildrenCount();
    }